

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O1

void __thiscall
World_3df::inverse(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  size_type *psVar1;
  size_type *psVar2;
  element_type *peVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  creat_t *pcVar7;
  ulong uVar8;
  ostream *poVar9;
  ulong uVar10;
  char *__function;
  size_t sVar11;
  element_type *peVar12;
  long lVar13;
  long lVar14;
  Msg local_3b8;
  Msg local_388;
  Msg local_358;
  Msg local_328;
  Msg local_2f8;
  Msg local_2c8;
  Msg local_298;
  Msg local_268;
  Msg local_238;
  Msg local_208;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  element_type *local_118;
  shared_count local_110;
  double local_108;
  double local_100;
  long local_f8;
  shared_ptr<Population> *local_f0;
  Msg local_e8;
  Msg local_b8;
  Msg local_88;
  element_type *local_58;
  ulong local_50;
  long local_48;
  long local_40;
  World_3df *local_38;
  
  peVar3 = (this->super_World).LOGFILE.px;
  local_268.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_268.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_268.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_268.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  local_268._vptr_Msg = (_func_int **)peVar3;
  local_38 = this;
  if (peVar3 == (element_type *)0x0) {
LAB_0011382c:
    __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,
                  "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<util::logging::File_logger>::operator*() const [T = util::logging::File_logger]"
                 );
  }
  util::logging::Msg::Msg(&local_208,"Inwersja z p_i = ",L_NORM);
  util::logging::Msg::operator+(&local_88,&local_208,0.001);
  psVar1 = &local_e8.msg_txt._M_string_length;
  local_e8._vptr_Msg = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"...","");
  util::logging::Msg::operator+(&local_b8,&local_88,(string *)&local_e8);
  (*(peVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar3,&local_b8);
  util::logging::Msg::~Msg(&local_b8);
  if (local_e8._vptr_Msg != (_func_int **)psVar1) {
    operator_delete(local_e8._vptr_Msg);
  }
  util::logging::Msg::~Msg(&local_88);
  util::logging::Msg::~Msg(&local_208);
  boost::detail::shared_count::~shared_count((shared_count *)&local_268.msg_txt);
  if ((dst->px != (element_type *)0x0) && (peVar12 = dst->px, peVar12 != (element_type *)0x0)) {
    sVar11 = dst->px->ELITE_SIZE;
    lVar13 = sVar11 << 4;
    local_48 = 0;
    local_40 = 0;
    local_f0 = dst;
    do {
      pcVar7 = Population::get_creatures(peVar12);
      if ((ulong)((long)(pcVar7->
                        super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pcVar7->
                        super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) <= sVar11) {
        peVar3 = (local_38->super_World).LOGFILE.px;
        local_2c8.msg_txt._M_dataplus._M_p = (pointer)(local_38->super_World).LOGFILE.pn.pi_;
        if ((sp_counted_base *)local_2c8.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
          LOCK();
          ((sp_counted_base *)local_2c8.msg_txt._M_dataplus._M_p)->use_count_ =
               ((sp_counted_base *)local_2c8.msg_txt._M_dataplus._M_p)->use_count_ + 1;
          UNLOCK();
        }
        local_2c8._vptr_Msg = (_func_int **)peVar3;
        if (peVar3 != (element_type *)0x0) {
          util::logging::Msg::Msg(&local_268,"... W sumie ",L_NORM);
          util::logging::Msg::operator+(&local_e8,&local_268,local_48);
          psVar1 = &local_238.msg_txt._M_string_length;
          local_238._vptr_Msg = (_func_int **)psVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_238," inwersji na ","");
          util::logging::Msg::operator+(&local_208,&local_e8,(string *)&local_238);
          util::logging::Msg::operator+(&local_88,&local_208,local_40);
          psVar2 = &local_298.msg_txt._M_string_length;
          local_298._vptr_Msg = (_func_int **)psVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298," genach","");
          util::logging::Msg::operator+(&local_b8,&local_88,(string *)&local_298);
          (*(peVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar3,&local_b8);
          util::logging::Msg::~Msg(&local_b8);
          if (local_298._vptr_Msg != (_func_int **)psVar2) {
            operator_delete(local_298._vptr_Msg);
          }
          util::logging::Msg::~Msg(&local_88);
          util::logging::Msg::~Msg(&local_208);
          if (local_238._vptr_Msg != (_func_int **)psVar1) {
            operator_delete(local_238._vptr_Msg);
          }
          util::logging::Msg::~Msg(&local_e8);
          util::logging::Msg::~Msg(&local_268);
          boost::detail::shared_count::~shared_count((shared_count *)&local_2c8.msg_txt);
          peVar3 = (local_38->super_World).LOGFILE.px;
          local_88.msg_txt._M_dataplus._M_p = (pointer)(local_38->super_World).LOGFILE.pn.pi_;
          if ((sp_counted_base *)local_88.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
            LOCK();
            ((sp_counted_base *)local_88.msg_txt._M_dataplus._M_p)->use_count_ =
                 ((sp_counted_base *)local_88.msg_txt._M_dataplus._M_p)->use_count_ + 1;
            UNLOCK();
          }
          local_88._vptr_Msg = (_func_int **)peVar3;
          if (peVar3 != (element_type *)0x0) {
            util::logging::Msg::Msg(&local_b8,anon_var_dwarf_371b6,L_NORM);
            (*(peVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar3,&local_b8);
            util::logging::Msg::~Msg(&local_b8);
            boost::detail::shared_count::~shared_count((shared_count *)&local_88.msg_txt);
            return;
          }
        }
        goto LAB_0011382c;
      }
      iVar5 = rand();
      uVar8 = (ulong)((double)iVar5 / 1.0000000004656613);
      if (((long)((double)iVar5 / 1.0000000004656613 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f
          | uVar8) < 0x20c49c) {
        if (dst->px != (Population *)0x0) {
          pcVar7 = Population::get_creatures(dst->px);
          lVar14 = *(long *)((long)&((pcVar7->
                                     super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->px + lVar13);
          if (lVar14 != 0) {
            local_108 = *(double *)(lVar14 + 0x30);
            iVar5 = rand();
            iVar6 = rand();
            peVar12 = dst->px;
            if (peVar12 == (element_type *)0x0) break;
            uVar10 = (ulong)((double)iVar5 / 89478485.33333333);
            uVar10 = (long)((double)iVar5 / 89478485.33333333 - 9.223372036854776e+18) &
                     (long)uVar10 >> 0x3f | uVar10;
            uVar8 = (ulong)((double)iVar6 / 89478485.33333333);
            lVar14 = ((long)((double)iVar6 / 89478485.33333333 - 9.223372036854776e+18) &
                      (long)uVar8 >> 0x3f | uVar8) + 0x1a;
            (*peVar12->_vptr_Population[5])(peVar12,sVar11,uVar10,lVar14);
            if (dst->px == (Population *)0x0) break;
            local_50 = sVar11;
            pcVar7 = Population::get_creatures(dst->px);
            lVar4 = *(long *)((long)&((pcVar7->
                                      super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->px + lVar13);
            local_f8 = lVar13;
            if (lVar4 != 0) {
              local_100 = *(double *)(lVar4 + 0x30);
              local_118 = (local_38->super_World).LOGFILE.px;
              local_110.pi_ = (local_38->super_World).LOGFILE.pn.pi_;
              if (local_110.pi_ != (sp_counted_base *)0x0) {
                LOCK();
                (local_110.pi_)->use_count_ = (local_110.pi_)->use_count_ + 1;
                UNLOCK();
              }
              local_58 = local_118;
              if (local_118 != (element_type *)0x0) {
                util::logging::Msg::Msg(&local_358,anon_var_dwarf_37254,L_NORM);
                util::logging::Msg::operator+(&local_2f8,&local_358,local_50);
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d8,anon_var_dwarf_372c0,anon_var_dwarf_372c0 + 0x19);
                util::logging::Msg::operator+(&local_388,&local_2f8,&local_1d8);
                util::logging::Msg::operator+(&local_328,&local_388,lVar14 - uVar10);
                local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b8,anon_var_dwarf_372d6,anon_var_dwarf_372d6 + 0x10);
                util::logging::Msg::operator+(&local_3b8,&local_328,&local_1b8);
                util::logging::Msg::operator+(&local_2c8,&local_3b8,uVar10);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_198," a ","");
                util::logging::Msg::operator+(&local_298,&local_2c8,&local_198);
                util::logging::Msg::operator+(&local_238,&local_298,lVar14);
                local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_178," {","");
                util::logging::Msg::operator+(&local_268,&local_238,&local_178);
                util::logging::Msg::operator+(&local_e8,&local_268,local_108);
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_158," -> ","");
                util::logging::Msg::operator+(&local_208,&local_e8,&local_158);
                util::logging::Msg::operator+(&local_88,&local_208,local_100);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"}","");
                util::logging::Msg::operator+(&local_b8,&local_88,&local_138);
                (*(local_58->super_Ostream_logger).super_Logger._vptr_Logger[3])(local_58,&local_b8)
                ;
                util::logging::Msg::~Msg(&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                }
                util::logging::Msg::~Msg(&local_88);
                util::logging::Msg::~Msg(&local_208);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p);
                }
                util::logging::Msg::~Msg(&local_e8);
                util::logging::Msg::~Msg(&local_268);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p != &local_178.field_2) {
                  operator_delete(local_178._M_dataplus._M_p);
                }
                util::logging::Msg::~Msg(&local_238);
                util::logging::Msg::~Msg(&local_298);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p);
                }
                util::logging::Msg::~Msg(&local_2c8);
                util::logging::Msg::~Msg(&local_3b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                  operator_delete(local_1b8._M_dataplus._M_p);
                }
                util::logging::Msg::~Msg(&local_328);
                util::logging::Msg::~Msg(&local_388);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p);
                }
                util::logging::Msg::~Msg(&local_2f8);
                util::logging::Msg::~Msg(&local_358);
                boost::detail::shared_count::~shared_count(&local_110);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"!! Inwersja na ",0xf);
                sVar11 = local_50;
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                local_48 = local_48 + 1;
                local_40 = local_40 + (lVar14 - uVar10);
                lVar13 = local_f8;
                dst = local_f0;
                goto LAB_00113606;
              }
              goto LAB_0011382c;
            }
          }
          __function = 
          "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Creature>::operator->() const [T = Creature]"
          ;
          goto LAB_00113822;
        }
        break;
      }
LAB_00113606:
      sVar11 = sVar11 + 1;
      peVar12 = dst->px;
      lVar13 = lVar13 + 0x10;
    } while (peVar12 != (element_type *)0x0);
  }
  __function = 
  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Population>::operator->() const [T = Population]"
  ;
LAB_00113822:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,__function);
}

Assistant:

void World_3df::inverse( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{
	const double prob = 0.001;

	(*get_log()) << util::logging::Msg("Inwersja z p_i = ") + prob + "...";

	size_t mcc = 0, mccc = 0;
	for(size_t i = dst->ELITE_SIZE; i < dst->get_creatures().size(); ++i)
	{
		if(probability(prob))
		{
			double m1 = dst->get_creatures()[i]->get_fitness();
			size_t p1 = frand(CHROMSIZE / 2 - 1), p2 = (CHROMSIZE / 2 + 1) + frand(CHROMSIZE / 2 - 1);

			dst->inverse(i, p1, p2);

			double m2 = dst->get_creatures()[i]->get_fitness();

			(*get_log()) << util::logging::Msg("... Stwór @ [") + static_cast<long long> (i)
					+ "] zaliczył inwersję na " + static_cast<long long> (p2 - p1) + " genach między "
					+ static_cast<long long> (p1) + " a " + static_cast<long long> (p2) + " {" + m1 + " -> " + m2 + "}";

			std::cout << "!! Inwersja na " << i << std::endl;

			mcc++;
			mccc += p2 - p1;
		}

	}
	(*get_log()) << util::logging::Msg("... W sumie ") + static_cast<long long> (mcc) + " inwersji na "
			+ static_cast<long long> (mccc) + " genach";

	(*get_log()) << "Już";
}